

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

InstanceSymbol *
slang::ast::InstanceSymbol::createVirtual
          (ASTContext *context,SourceLocation loc,Definition *definition,
          ParameterValueAssignmentSyntax *paramAssignments)

{
  string_view definitionName;
  Scope *pSVar1;
  InstanceSymbol *pIVar2;
  bool local_1d9;
  InstanceSymbol *local_1d8;
  InstanceSymbol *result;
  Compilation *comp;
  span<const_slang::ast::Definition::ParameterDecl,_18446744073709551615UL> local_1b8;
  size_t local_1a8;
  char *pcStack_1a0;
  undefined1 local_198 [8];
  ParameterBuilder paramBuilder;
  ParameterValueAssignmentSyntax *paramAssignments_local;
  Definition *definition_local;
  ASTContext *context_local;
  SourceLocation loc_local;
  
  paramBuilder._360_8_ = paramAssignments;
  context_local = (ASTContext *)loc;
  pSVar1 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
  local_1a8 = (definition->name)._M_len;
  pcStack_1a0 = (definition->name)._M_str;
  nonstd::span_lite::span<const_slang::ast::Definition::ParameterDecl,_18446744073709551615UL>::
  span<slang::SmallVector<slang::ast::Definition::ParameterDecl,_8UL>,_0>
            (&local_1b8,&definition->parameters);
  definitionName._M_str = pcStack_1a0;
  definitionName._M_len = local_1a8;
  ParameterBuilder::ParameterBuilder((ParameterBuilder *)local_198,pSVar1,definitionName,local_1b8);
  ParameterBuilder::setInstanceContext((ParameterBuilder *)local_198,context);
  if (paramBuilder._360_8_ != 0) {
    ParameterBuilder::setAssignments
              ((ParameterBuilder *)local_198,(ParameterValueAssignmentSyntax *)paramBuilder._360_8_)
    ;
  }
  result = (InstanceSymbol *)ASTContext::getCompilation(context);
  local_1d9 = false;
  pIVar2 = BumpAllocator::
           emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation&,slang::ast::Definition_const&,slang::ast::ParameterBuilder&,bool>
                     ((BumpAllocator *)result,(Compilation *)result,&definition->name,
                      (SourceLocation *)&context_local,definition,(ParameterBuilder *)local_198,
                      &local_1d9);
  local_1d8 = pIVar2;
  pSVar1 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
  Symbol::setParent((Symbol *)pIVar2,pSVar1);
  pIVar2 = local_1d8;
  ParameterBuilder::~ParameterBuilder((ParameterBuilder *)local_198);
  return pIVar2;
}

Assistant:

InstanceSymbol& InstanceSymbol::createVirtual(
    const ASTContext& context, SourceLocation loc, const Definition& definition,
    const ParameterValueAssignmentSyntax* paramAssignments) {

    ParameterBuilder paramBuilder(*context.scope, definition.name, definition.parameters);
    paramBuilder.setInstanceContext(context);
    if (paramAssignments)
        paramBuilder.setAssignments(*paramAssignments);

    auto& comp = context.getCompilation();
    auto& result = *comp.emplace<InstanceSymbol>(comp, definition.name, loc, definition,
                                                 paramBuilder,
                                                 /* isUninstantiated */ false);

    // Set the parent pointer so that traversing upwards still works to find
    // the instantiation scope. This "virtual" instance never actually gets
    // added to the scope the proper way as a member.
    result.setParent(*context.scope);
    return result;
}